

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xdmauth.c
# Opt level: O0

ssh_cipher * des_xdmauth_cipher(void *vkeydata)

{
  ssh_cipher *c_00;
  ssh_cipher *c;
  uint bits;
  int j;
  int nbits;
  int i;
  uchar key [8];
  uchar *keydata;
  void *vkeydata_local;
  
  c._0_4_ = 0;
  bits = 0;
  c._4_4_ = 0;
  for (j = 0; j < 8; j = j + 1) {
    if ((int)bits < 7) {
      c._0_4_ = (uint)c << 8 | (uint)*(byte *)((long)vkeydata + (long)c._4_4_);
      bits = bits + 8;
      c._4_4_ = c._4_4_ + 1;
    }
    *(char *)((long)&nbits + (long)j) = (char)(((uint)c >> ((char)bits - 7U & 0x1f)) << 1);
    c._0_4_ = (0x7f << ((char)bits - 7U & 0x1f) ^ 0xffffffffU) & (uint)c;
    bits = bits - 7;
  }
  key = (uchar  [8])vkeydata;
  c_00 = ssh_cipher_new(&ssh_des);
  ssh_cipher_setkey(c_00,&nbits);
  smemclr(&nbits,8);
  ssh_cipher_setiv(c_00,&nbits);
  return c_00;
}

Assistant:

static ssh_cipher *des_xdmauth_cipher(const void *vkeydata)
{
    /*
     * XDM-AUTHORIZATION-1 uses single-DES, but packs the key into 7
     * bytes, so here we have to repack it manually into the canonical
     * form where it occupies 8 bytes each with the low bit unused.
     */
    const unsigned char *keydata = (const unsigned char *)vkeydata;
    unsigned char key[8];
    int i, nbits, j;
    unsigned int bits;

    bits = 0;
    nbits = 0;
    j = 0;
    for (i = 0; i < 8; i++) {
        if (nbits < 7) {
            bits = (bits << 8) | keydata[j];
            nbits += 8;
            j++;
        }
        key[i] = (bits >> (nbits - 7)) << 1;
        bits &= ~(0x7F << (nbits - 7));
        nbits -= 7;
    }

    ssh_cipher *c = ssh_cipher_new(&ssh_des);
    ssh_cipher_setkey(c, key);
    smemclr(key, sizeof(key));
    ssh_cipher_setiv(c, key);
    return c;
}